

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponsePdu.cpp
# Opt level: O3

int __thiscall DIS::ActionResponsePdu::getMarshalledSize(ActionResponsePdu *this)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pFVar5;
  pointer pVVar6;
  ulong uVar7;
  long lVar8;
  FixedDatum listElement;
  VariableDatum local_60;
  
  iVar2 = SimulationManagementFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_originatingID);
  iVar4 = EntityID::getMarshalledSize(&this->_receivingID);
  iVar2 = iVar4 + iVar3 + iVar2 + 0x10;
  pFVar5 = (this->_fixedDatums).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar5) {
    lVar8 = 8;
    uVar7 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__FixedDatum_001b4c68;
      local_60._8_8_ = *(undefined8 *)((long)&pFVar5->_vptr_FixedDatum + lVar8);
      iVar3 = FixedDatum::getMarshalledSize((FixedDatum *)&local_60);
      iVar2 = iVar2 + iVar3;
      FixedDatum::~FixedDatum((FixedDatum *)&local_60);
      uVar7 = uVar7 + 1;
      pFVar5 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 < (ulong)((long)(this->_fixedDatums).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >> 4));
  }
  pVVar6 = (this->_variableDatums).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatums).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar6) {
    lVar8 = 0x18;
    uVar7 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__VariableDatum_001b6628;
      puVar1 = (undefined8 *)((long)pVVar6 + lVar8 + -0x10);
      local_60._8_8_ = *puVar1;
      local_60._16_8_ = puVar1[1];
      std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::vector
                (&local_60._variableDatums,
                 (vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_> *)
                 ((long)&pVVar6->_vptr_VariableDatum + lVar8));
      iVar3 = VariableDatum::getMarshalledSize(&local_60);
      iVar2 = iVar2 + iVar3;
      VariableDatum::~VariableDatum(&local_60);
      uVar7 = uVar7 + 1;
      pVVar6 = (this->_variableDatums).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x30;
    } while (uVar7 < (ulong)(((long)(this->_variableDatums).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 4)
                            * -0x5555555555555555));
  }
  return iVar2;
}

Assistant:

int ActionResponsePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _originatingID.getMarshalledSize();  // _originatingID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 4;  // _requestStatus
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatums.size(); idx++)
   {
        FixedDatum listElement = _fixedDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatums.size(); idx++)
   {
        VariableDatum listElement = _variableDatums[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}